

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_11,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  bool bVar2;
  bool bVar3;
  float *pfVar4;
  long lVar5;
  float *pfVar6;
  int col;
  long lVar7;
  int col_1;
  float v;
  float fVar8;
  float local_5c [5];
  Type in1;
  Type in0;
  int aiStack_18 [6];
  
  pfVar1 = in0.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    pfVar4 = (float *)&in0;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar7 = 0;
      do {
        fVar8 = 1.0;
        if (lVar5 != lVar7) {
          fVar8 = 0.0;
        }
        pfVar4[lVar7 * 2] = fVar8;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar5 = 1;
      pfVar4 = pfVar1;
      bVar2 = false;
    } while (bVar3);
    in0.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in0.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    in0.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    in0.m_data.m_data[3].m_data[0] = 0.0;
    in0.m_data.m_data[3].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    lVar5 = 0;
    pfVar4 = (float *)&in0;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar7 = 0;
      do {
        pfVar4[lVar7 * 2] = *(float *)((long)&s_constInMat4x2 + lVar5 + lVar7 * 4);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar5 = 0x10;
      pfVar4 = pfVar1;
      bVar2 = false;
    } while (bVar3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    in1.m_data[0] = (evalCtx->coords).m_data[0];
    in1.m_data[1] = (evalCtx->coords).m_data[1];
    in1.m_data[2] = (evalCtx->coords).m_data[2];
    in1.m_data[3] = (evalCtx->coords).m_data[3];
  }
  else {
    in1.m_data[0] = (float)0x3e4ccccd;
    in1.m_data[1] = (float)0xbf800000;
    in1.m_data[2] = (float)0x3f000000;
    in1.m_data[3] = (float)0x3f4ccccd;
  }
  local_5c[1] = 0.0;
  local_5c[0] = 0.0;
  pfVar4 = local_5c + 1;
  pfVar6 = (float *)&in0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    fVar8 = 0.0;
    lVar5 = 0;
    do {
      fVar8 = fVar8 + pfVar6[lVar5 * 2] * in1.m_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    *pfVar4 = fVar8;
    pfVar4 = local_5c;
    pfVar6 = pfVar1;
    bVar2 = false;
  } while (bVar3);
  local_5c[2] = local_5c[1];
  local_5c[3] = local_5c[0];
  local_5c[4] = local_5c[1];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar5]] = local_5c[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}